

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O3

chunk_conflict * mtntop_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  loc to_avoid;
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  chunk *c;
  ulong uVar9;
  loc lVar10;
  loc lVar11;
  feature *pfVar12;
  loc_conflict lVar13;
  loc_conflict lVar14;
  wchar_t wVar15;
  wchar_t *pwVar16;
  wchar_t unaff_EBP;
  uint uVar17;
  long lVar18;
  loc grid;
  ulong uVar19;
  loc grid_00;
  wchar_t wVar20;
  wchar_t wVar21;
  long lVar22;
  loc grid_01;
  loc_conflict grid1;
  wchar_t wVar23;
  wchar_t wVar24;
  wchar_t wVar25;
  int A;
  long lVar26;
  loc grid_02;
  wchar_t x1;
  int iVar27;
  int iVar28;
  uint local_50;
  uint32_t local_48;
  
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  wVar15 = c->height;
  if (L'\0' < wVar15) {
    uVar9 = (ulong)(uint)c->width;
    lVar26 = 0;
    lVar22 = 0;
    do {
      lVar18 = 0;
      if (0 < (int)uVar9) {
        lVar18 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar26 + lVar18),FEAT_VOID);
          lVar18 = lVar18 + 1;
          uVar9 = (ulong)c->width;
        } while (lVar18 < (long)uVar9);
        wVar15 = c->height;
      }
      unaff_EBP = (wchar_t)lVar18;
      lVar22 = lVar22 + 1;
      lVar26 = lVar26 + 0x100000000;
    } while (lVar22 < wVar15);
  }
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,false,false);
  do {
    uVar3 = Rand_div(6);
    uVar4 = Rand_div(5);
    wVar25 = c->height / 2;
    wVar21 = c->width / 2;
    wVar23 = wVar25 - (uVar4 + 4);
    x1 = wVar21 - (uVar3 + 4);
    wVar15 = wVar25 + uVar4 + L'\x04';
    wVar20 = wVar21 + L'\x04' + uVar3;
    _Var1 = generate_starburst_room(c,wVar23,x1,wVar15,wVar20,false,FEAT_ROAD,false);
  } while (!_Var1);
  uVar9 = (ulong)(uint)wVar21;
  grid_02.y = wVar25;
  grid_02.x = wVar21;
  square_set_feat((chunk_conflict *)c,grid_02,FEAT_GRANITE);
  square_mark((chunk_conflict *)c,grid_02);
  lVar22 = 0;
  do {
    lVar11 = ddgrid[lVar22];
    lVar10 = (loc)loc_sum((loc_conflict)grid_02,(loc_conflict)lVar11);
    square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
    lVar11 = (loc)loc_sum((loc_conflict)grid_02,(loc_conflict)lVar11);
    square_mark((chunk_conflict *)c,lVar11);
    lVar22 = lVar22 + 1;
  } while (lVar22 != 8);
  uVar4 = 0;
  if (wVar23 < wVar15) {
    uVar4 = 0;
    wVar25 = wVar23;
    do {
      wVar24 = x1;
      iVar27 = uVar3 * 2 + 8;
      unaff_EBP = x1;
      if (x1 < wVar20) {
        do {
          lVar11.y = wVar25;
          lVar11.x = wVar24;
          pfVar12 = square_feat((chunk_conflict *)c,lVar11);
          uVar4 = uVar4 + (pfVar12->fidx == FEAT_ROAD);
          iVar27 = iVar27 + -1;
          wVar24 = wVar24 + L'\x01';
          unaff_EBP = wVar20;
        } while (iVar27 != 0);
      }
      wVar25 = wVar25 + L'\x01';
    } while (wVar25 != wVar15);
  }
  uVar5 = Rand_div(uVar4);
  uVar6 = Rand_div(2);
  if (uVar6 == 0) {
    wVar25 = rand_range(wVar23,wVar15);
    lVar10.y = wVar25;
    lVar10.x = unaff_EBP;
    pfVar12 = square_feat((chunk_conflict *)c,lVar10);
    if (pfVar12->fidx != FEAT_VOID) {
      uVar6 = Rand_div(2);
      iVar27 = 0;
      if (uVar3 + 5 != 0) {
        local_50 = -(uint)(uVar6 != 0) | 1;
        iVar28 = (uVar3 + 5) * (-(uint)(uVar6 != 0) | 1);
        do {
          uVar9 = (ulong)(uint)(wVar21 + iVar27);
          grid_00.y = wVar25;
          grid_00.x = wVar21 + iVar27;
          pfVar12 = square_feat((chunk_conflict *)c,grid_00);
          if (pfVar12->fidx == FEAT_VOID) goto LAB_0015cdcb;
          iVar27 = iVar27 + local_50;
        } while (iVar28 != iVar27);
        uVar9 = (ulong)(uint)(iVar28 + wVar21);
      }
LAB_0015cdcb:
      square_set_feat((chunk_conflict *)c,(loc)((ulong)(uint)wVar25 << 0x20 | uVar9),FEAT_MORE);
    }
  }
  if (wVar23 < wVar15) {
    do {
      wVar21 = x1;
      iVar27 = uVar3 * 2 + 8;
      if (x1 < wVar20) {
        do {
          grid_01.y = wVar23;
          grid_01.x = wVar21;
          pfVar12 = square_feat((chunk_conflict *)c,grid_01);
          if (((pfVar12->fidx != FEAT_VOID) &&
              (pfVar12 = square_feat((chunk_conflict *)c,grid_01), pfVar12->fidx != FEAT_GRANITE))
             && (pfVar12 = square_feat((chunk_conflict *)c,grid_01), pfVar12->fidx != FEAT_MORE)) {
            pfVar12 = square_feat((chunk_conflict *)c,grid_01);
            if ((pfVar12->fidx == FEAT_ROAD) && (uVar4 = uVar4 - 1, uVar4 == uVar5)) {
              player_place((chunk_conflict2 *)c,p,(loc_conflict)grid_01);
              square_mark((chunk_conflict *)c,grid_01);
              uVar4 = uVar5;
            }
            else {
              uVar6 = Rand_div(5);
              if (uVar6 == 0) {
                pwVar16 = &FEAT_GRANITE;
              }
              else {
                uVar6 = Rand_div(8);
                if (uVar6 == 0) {
                  pwVar16 = &FEAT_PASS_RUBBLE;
                }
                else {
                  uVar6 = Rand_div(0x14);
                  if (uVar6 != 0) goto LAB_0015cf11;
                  pwVar16 = &FEAT_TREE2;
                }
              }
              square_set_feat((chunk_conflict *)c,grid_01,*pwVar16);
            }
          }
LAB_0015cf11:
          iVar27 = iVar27 + -1;
          wVar21 = wVar21 + L'\x01';
        } while (iVar27 != 0);
      }
      wVar23 = wVar23 + L'\x01';
    } while (wVar23 != wVar15);
  }
  local_48 = Rand_div(4);
  iVar27 = 0;
  do {
    uVar3 = Rand_div(6);
    A = uVar3 + 4;
    uVar4 = Rand_div(5);
    iVar28 = uVar4 + 4;
    iVar7 = rand_range(iVar28,(c->height - uVar4) + -5);
    iVar8 = rand_range(A,(c->width - uVar3) + -5);
    lVar13 = loc(-4 - uVar3,-4 - uVar4);
    grid1.y = iVar7;
    grid1.x = iVar8;
    lVar13 = loc_sum(grid1,lVar13);
    lVar14 = loc(A,iVar28);
    lVar14 = loc_sum(grid1,lVar14);
    _Var1 = check_clearing_space((chunk_conflict *)c,lVar13,lVar14);
    if (_Var1) {
      wVar21 = iVar7 - iVar28;
      wVar15 = iVar8 - A;
      wVar20 = iVar7 + iVar28;
      _Var1 = generate_starburst_room(c,wVar21,wVar15,wVar20,iVar8 + A,false,FEAT_ROAD,false);
      if (_Var1) {
        if (wVar21 < wVar20) {
          do {
            wVar23 = wVar15;
            iVar28 = uVar3 * 2 + 8;
            if (wVar15 < iVar8 + A) {
              do {
                grid.y = wVar21;
                grid.x = wVar23;
                pfVar12 = square_feat((chunk_conflict *)c,grid);
                if (pfVar12->fidx != FEAT_VOID) {
                  uVar4 = Rand_div(5);
                  pwVar16 = &FEAT_GRANITE;
                  if (uVar4 != 0) {
                    uVar4 = Rand_div(8);
                    pwVar16 = &FEAT_PASS_RUBBLE;
                    if (uVar4 != 0) {
                      uVar4 = Rand_div(0x14);
                      pwVar16 = &FEAT_TREE2;
                      if (uVar4 != 0) goto LAB_0015d106;
                    }
                  }
                  square_set_feat((chunk_conflict *)c,grid,*pwVar16);
                }
LAB_0015d106:
                iVar28 = iVar28 + -1;
                wVar23 = wVar23 + L'\x01';
              } while (iVar28 != 0);
            }
            wVar21 = wVar21 + L'\x01';
          } while (wVar21 != wVar20);
        }
        local_48 = local_48 - 1;
        if (local_48 == 0) break;
      }
    }
    iVar27 = iVar27 + 1;
  } while (iVar27 != 10);
  wVar15 = c->height;
  if (L'\0' < wVar15) {
    wVar20 = c->width;
    lVar22 = 0;
    uVar9 = 0;
    do {
      if (L'\0' < wVar20) {
        uVar19 = 0;
        do {
          square_unmark((chunk_conflict *)c,(loc)(lVar22 + uVar19));
          if (((uVar19 == 0 || uVar9 == 0) || (uVar9 == (uint)(c->height + L'\xffffffff'))) ||
             (wVar20 = c->width, uVar19 == (uint)(wVar20 + L'\xffffffff'))) {
            square_set_feat((chunk_conflict *)c,(loc)(lVar22 + uVar19),FEAT_PERM);
            wVar20 = c->width;
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)wVar20);
        wVar15 = c->height;
      }
      uVar9 = uVar9 + 1;
      lVar22 = lVar22 + 0x100000000;
    } while ((long)uVar9 < (long)wVar15);
  }
  wVar15 = c->depth;
  get_mon_num(wVar15,wVar15);
  if (L'\0' < wVar15) {
    uVar17 = wVar15 + L'\x01';
    do {
      to_avoid.x = (player->grid).x;
      to_avoid.y = (player->grid).y;
      pick_and_place_distant_monster(c,to_avoid,L'\n',true,c->depth);
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
  }
  iVar2 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar2,c->depth,'\x01');
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *mtntop_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	struct loc grid, top;
	int i, j, k;
	int plats, a, b;
	int spot, floors = 0;
	bool placed = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Start with void */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create void */
			square_set_feat(c, grid, FEAT_VOID);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Make the main mountaintop */
	while (!placed) {
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = c->height / 2;
		top.x = c->width / 2;
		placed = generate_starburst_room(c, top.y - b, top.x - a, top.y + b,
										 top.x + a, false, FEAT_ROAD, false);
	}

	/* Summit */
	square_set_feat(c, top, FEAT_GRANITE);
	square_mark(c, top);
	for (i = 0; i < 8; i++) {
		square_set_feat(c, loc_sum(top, ddgrid[i]), FEAT_GRANITE);
		square_mark(c, loc_sum(top, ddgrid[i]));
	}

	/* Count the floors */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors++;
			}
		}
	}

	/* Choose the player place */
	spot = randint0(floors);

	/* Can we get down? */
	if (one_in_(2)) {
		grid.y = rand_range(top.y - b, top.y + b);
		if (square_feat(c, grid)->fidx != FEAT_VOID) {
			i = one_in_(2) ? 1 : -1;
			for (grid.x = top.x; grid.x != (top.x + i * (a + 1)); grid.x += i) {
				if (square_feat(c, grid)->fidx == FEAT_VOID) break;
			}
			square_set_feat(c, grid, FEAT_MORE);
		}
	}

	/* Adjust the terrain, place the player */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			/* Only change generated stuff */
			if (square_feat(c, grid)->fidx == FEAT_VOID)
				continue;

			/* Leave rock */
			if (square_feat(c, grid)->fidx == FEAT_GRANITE)
				continue;

			/* Leave stair */
			if (square_feat(c, grid)->fidx == FEAT_MORE)
				continue;

			/* Place the player? */
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors--;
				if (floors == spot) {
					player_place(c, p, grid);
					square_mark(c, grid);
					continue;
				}
			}

			/* Place some rock */
			if (one_in_(5)) {
				square_set_feat(c, grid, FEAT_GRANITE);
				continue;
			}

			/* rubble */
			if (one_in_(8)) {
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				continue;
			}

			/* and the odd tree */
			if (one_in_(20)) {
				square_set_feat(c, grid, FEAT_TREE2);
				continue;
			}
		}
	}

	/* Make a few "plateaux" */
	plats = randint0(4);

	/* Try fairly hard */
	for (j = 0; j < 10; j++) {
		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = rand_range(b, c->height - 1 - b);
		top.x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(top, loc(-a, -b)),
				loc_sum(top, loc(a, b)))
				|| !generate_starburst_room(c, top.y - b,
				top.x - a, top.y + b, top.x + a, false,
				FEAT_ROAD, false)) continue;

		/* Success */
		plats--;

		/* Adjust the terrain a bit */
		for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
			for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
				/* Only change generated stuff */
				if (square_feat(c, grid)->fidx == FEAT_VOID)
					continue;

				/* Place some rock */
				if (one_in_(5)) {
					square_set_feat(c, grid, FEAT_GRANITE);
					continue;
				}

				/* rubble */
				if (one_in_(8)) {
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
					continue;
				}

				/* and the odd tree */
				if (one_in_(20)) {
					square_set_feat(c, grid, FEAT_TREE2);
					continue;
				}
			}
		}

		/* Done ? */
		if (!plats)
			break;
	}


	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);

			/* Paranoia - remake the dungeon walls */
			if ((grid.y == 0) || (grid.x == 0) ||
				(grid.y == c->height - 1) || (grid.x == c->width - 1)) {
				square_set_feat(c, grid, FEAT_PERM);
			}
		}
	}

	/* Basic "amount" */
	k = c->depth;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = k; j > 0; j--) {
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}


	/* Put some objects in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);


	return c;
}